

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * CMU462::operator*(double c,Matrix3x3 *A)

{
  double *in_RSI;
  Matrix3x3 *in_RDI;
  double in_XMM0_Qa;
  double *cAij;
  double *Aij;
  Matrix3x3 *cA;
  Matrix3x3 *in_stack_ffffffffffffffe0;
  
  Matrix3x3::Matrix3x3(in_stack_ffffffffffffffe0);
  in_RDI->entries[0].x = in_XMM0_Qa * *in_RSI;
  in_RDI->entries[0].y = in_XMM0_Qa * in_RSI[1];
  in_RDI->entries[0].z = in_XMM0_Qa * in_RSI[2];
  in_RDI->entries[1].x = in_XMM0_Qa * in_RSI[3];
  in_RDI->entries[1].y = in_XMM0_Qa * in_RSI[4];
  in_RDI->entries[1].z = in_XMM0_Qa * in_RSI[5];
  in_RDI->entries[2].x = in_XMM0_Qa * in_RSI[6];
  in_RDI->entries[2].y = in_XMM0_Qa * in_RSI[7];
  in_RDI->entries[2].z = in_XMM0_Qa * in_RSI[8];
  return in_RDI;
}

Assistant:

Matrix3x3 operator*( double c, const Matrix3x3& A ) {

    Matrix3x3 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);

    return cA;
  }